

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O3

void __thiscall rengine::GlyphTextureJob::onExecute(GlyphTextureJob *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  uint *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  char cVar4;
  int iVar5;
  uchar *output;
  long lVar6;
  ostream *poVar7;
  stbtt_fontinfo *psVar8;
  int out_h;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  int local_114;
  ulong uStack_110;
  int lineGap;
  element_type *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  void *pvStack_d8;
  vector<float,_std::allocator<float>_> advances;
  int local_b8;
  int descent;
  int x1;
  int y0;
  int y1;
  float local_a4;
  GlyphTextureJob *local_a0;
  pointer piStack_98;
  vector<int,_std::allocator<int>_> glyphs;
  uint *puStack_78;
  int g;
  int local_5c;
  stbtt_fontinfo *psStack_58;
  int ascent;
  ulong local_50;
  int local_48;
  int local_44;
  int leftSideBearing;
  int x0;
  int advance;
  float local_34;
  float xpos;
  
  local_e0 = std::chrono::_V2::system_clock::now();
  psVar8 = &this->m_context->m_fontInfo;
  local_34 = stbtt_ScaleForPixelHeight(psVar8,(float)this->m_pixelSize);
  psStack_58 = psVar8;
  stbtt_GetFontVMetrics
            (psVar8,&local_5c,
             (int *)((long)&advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),&local_114);
  psVar8 = psStack_58;
  glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  piStack_98 = (pointer)0x0;
  glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pvStack_d8 = (void *)0x0;
  advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  advance = 0;
  cVar4 = *(this->m_text)._M_dataplus._M_p;
  if (cVar4 == '\0') {
    local_50 = 0;
    iVar10 = 0;
  }
  else {
    uVar9 = 0;
    iVar10 = 0;
    local_50 = 0;
    do {
      iVar5 = stbtt_FindGlyphIndex(psStack_58,(int)cVar4);
      puStack_78 = (uint *)CONCAT44(puStack_78._4_4_,iVar5);
      if (1 < uVar9) {
        iVar5 = stbtt_GetCodepointKernAdvance
                          (psStack_58,
                           glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[-1],iVar5);
        advance = (int)((float)iVar5 * local_34 + (float)advance);
        iVar5 = (int)puStack_78;
      }
      stbtt_GetGlyphHMetrics(psVar8,iVar5,&leftSideBearing,&local_48);
      x0 = advance;
      fVar12 = floorf((float)advance);
      stbtt_GetGlyphBitmapBoxSubpixel
                (psVar8,(int)puStack_78,local_34,local_34,(float)x0 - fVar12,0.0,&local_44,&descent,
                 &local_b8,&x1);
      if (iVar10 < local_b8 - local_44) {
        iVar10 = local_b8 - local_44;
      }
      iVar5 = (int)local_50;
      local_50 = local_50 & 0xffffffff;
      if (iVar5 < x1 - descent) {
        local_50 = (ulong)(uint)(x1 - descent);
      }
      advance = (int)((float)(leftSideBearing - local_48) * local_34 + (float)advance);
      if (advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start ==
          advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&pvStack_d8,
                   (iterator)
                   advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,(float *)&advance);
      }
      else {
        *advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start = (float)advance;
        advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      }
      if (glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&piStack_98,
                   (iterator)
                   glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(int *)&puStack_78);
      }
      else {
        *glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)puStack_78;
        glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      }
      cVar4 = (this->m_text)._M_dataplus._M_p[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (cVar4 != '\0');
  }
  fVar12 = ceilf((float)advance);
  this->m_textureWidth = (int)fVar12;
  fVar13 = ceilf((float)(local_5c -
                        advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_) * local_34);
  this->m_textureHeight = (int)fVar13;
  y1 = iVar10;
  output = (uchar *)malloc((ulong)(uint)(iVar10 * (int)local_50));
  local_108 = (element_type *)calloc((long)((int)fVar13 * (int)fVar12),4);
  puStack_78 = local_108;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(void*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&g,local_108,free);
  _Var3._M_pi = _g;
  puVar2 = puStack_78;
  puStack_78 = (uint *)0x0;
  _g = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_textureData).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_textureData).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = puVar2
  ;
  (this->m_textureData).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  local_a0 = this;
  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
     _g != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_g);
  }
  if (glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != piStack_98) {
    fVar12 = (local_a0->m_color).w;
    local_100 = (ulong)(uint)(int)(fVar12 * 255.0);
    local_f8 = (ulong)(uint)(int)((local_a0->m_color).x * fVar12 * 255.0);
    local_f0 = (ulong)(uint)(int)((local_a0->m_color).y * fVar12 * 255.0);
    local_e8 = (ulong)(uint)(int)(fVar12 * (local_a0->m_color).z * 255.0);
    local_a4 = local_34 * (float)local_5c;
    fVar12 = 0.0;
    uVar9 = 0;
    uVar11 = 1;
    do {
      iVar10 = piStack_98[uVar9];
      x0 = (int)fVar12;
      fVar12 = floorf(fVar12);
      y0 = (int)((float)x0 - fVar12);
      stbtt_GetGlyphBitmapBoxSubpixel
                (psStack_58,iVar10,local_34,local_34,(float)y0,0.0,(int *)&puStack_78,
                 &leftSideBearing,&local_48,&local_44);
      iVar5 = local_48 - (int)puStack_78;
      uStack_110 = uVar9;
      if (y1 < iVar5) {
        __assert_fail("x1 - x0 <= maxBmWidth",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xc2,"virtual void rengine::GlyphTextureJob::onExecute()");
      }
      out_h = local_44 - leftSideBearing;
      if ((int)local_50 < out_h) {
        __assert_fail("y1 - y0 <= maxBmHeight",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xc3,"virtual void rengine::GlyphTextureJob::onExecute()");
      }
      stbtt_MakeGlyphBitmapSubpixel
                (psStack_58,output,iVar5,out_h,iVar5,local_34,local_34,(float)y0,0.0,iVar10);
      renderSingleGlyph(local_a0,(int)(float)x0,(int)((float)leftSideBearing + local_a4),local_108,
                        local_a0->m_textureWidth,local_a0->m_textureHeight,output,iVar5,out_h,
                        (int)local_f8,(int)local_f0,(int)local_e8,(int)local_100);
      fVar12 = *(float *)((long)pvStack_d8 + uStack_110 * 4);
      bVar1 = uVar11 < (ulong)((long)glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start - (long)piStack_98 >> 2);
      uVar9 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar1);
  }
  free(output);
  lVar6 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"generated glyph texture for \'",0x1d);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(local_a0->m_text)._M_dataplus._M_p,
                      (local_a0->m_text)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' in ",5);
  poVar7 = std::ostream::_M_insert<double>(((double)(lVar6 - local_e0) / 1000000000.0) * 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (pvStack_d8 != (void *)0x0) {
    operator_delete(pvStack_d8);
  }
  if (piStack_98 != (pointer)0x0) {
    operator_delete(piStack_98);
  }
  return;
}

Assistant:

inline void GlyphTextureJob::onExecute()
{
    auto start = std::chrono::system_clock::now();

    const stbtt_fontinfo *fontInfo = m_context->fontInfo();
    float scale = stbtt_ScaleForPixelHeight(fontInfo, m_pixelSize);

    int ascent, descent, lineGap;
    stbtt_GetFontVMetrics(fontInfo, &ascent, &descent, &lineGap);

    // std::cout << "GlyphTextureJob::onExecute: text='" << m_text
    //           << "', size=" << m_pixelSize
    //           << ", scale=" << scale
    //           << ", ascent=" << ascent
    //           << ", descent=" << descent
    //           << ", lineGap=" << lineGap
    //           << std::endl;

    std::vector<int> glyphs;
    std::vector<float> advances;

    float xpos = 0;

    int maxBmWidth = 0;
    int maxBmHeight = 0;

    for (int i=0; m_text[i]; ++i) {
        int g = stbtt_FindGlyphIndex(fontInfo, m_text[i]);
        if (i > 1) {
            xpos += scale*stbtt_GetCodepointKernAdvance(fontInfo, glyphs.back(), g);
        }
        int advance, leftSideBearing;
        stbtt_GetGlyphHMetrics(fontInfo, g, &advance, &leftSideBearing);

        float xShift = xpos - (float) std::floor(xpos);
        int x0, x1, y0, y1;
        stbtt_GetGlyphBitmapBoxSubpixel(fontInfo, g, scale, scale, xShift, 0, &x0, &y0, &x1, &y1);
        maxBmWidth = std::max(x1 - x0, maxBmWidth);
        maxBmHeight = std::max(y1 - y0, maxBmHeight);

        // std::cout << " - '" << m_text[i] << "': index=" << g << ", advance=" << advance << "/" << xpos << ", lsb=" << leftSideBearing
        //           << ", box=" << x0 << "-" << x1 << ", " << y0 << "-" << y1 << std::endl;

        xpos += scale * (advance - leftSideBearing);

        advances.push_back(xpos);
        glyphs.push_back(g);
    }

    m_textureWidth = std::ceil(xpos);
    m_textureHeight = std::ceil((ascent - descent) * scale);

    // std::cout << " - dimensions texture=" << m_textureWidth << "x" << m_textureHeight
    //           << ", bitmap=" << maxBmWidth << "x" << maxBmHeight << std::endl;

    unsigned char *bmData = (unsigned char *) malloc(maxBmWidth * maxBmHeight);
    unsigned int *textureData = (unsigned int *) calloc(m_textureWidth * m_textureHeight, 4);
    m_textureData = std::shared_ptr<unsigned int>(textureData, free);

    int ca = m_color.w * 255;
    int cr = m_color.w * m_color.x * 255;
    int cg = m_color.w * m_color.y * 255;
    int cb = m_color.w * m_color.z * 255;

    float x = 0;
    float y = ascent * scale;
    for (unsigned i=0; i<glyphs.size(); ++i) {
        int glyph = glyphs[i];

        int x0, y0, x1, y1;

        float xShift = x - (float) std::floor(x);
        stbtt_GetGlyphBitmapBoxSubpixel(fontInfo, glyph, scale, scale, xShift, 0, &x0, &y0, &x1, &y1);

        assert(x1 - x0 <= maxBmWidth);
        assert(y1 - y0 <= maxBmHeight);

        int bmw = x1 - x0;
        int bmh = y1 - y0;
        stbtt_MakeGlyphBitmapSubpixel(fontInfo, bmData, bmw, bmh, bmw, scale, scale, xShift, 0, glyph);

        renderSingleGlyph(x, y + y0,
                          textureData, m_textureWidth, m_textureHeight,
                          bmData, bmw, bmh,
                          cr, cg, cb, ca);

        x = advances[i];
    }

    free(bmData);

    auto end = std::chrono::system_clock::now();
    std::chrono::duration<double> diff = end - start;
    std::cout << "generated glyph texture for '" << m_text << "' in " << diff.count() * 1000 << " ms" << std::endl;
}